

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Validity * __thiscall
capnp::compiler::CompilerMain::checkPlausibility
          (Validity *__return_storage_ptr__,CompilerMain *this,Format format,
          ArrayPtr<const_unsigned_char> prefix)

{
  bool bVar1;
  Plausibility PVar2;
  NullableValue<capnp::compiler::CompilerMain::Format> *pNVar3;
  Format *pFVar4;
  NullableValue<capnp::compiler::CompilerMain::Format> NVar5;
  Compiler *pCVar6;
  Compiler *params_2;
  StringPtr SVar7;
  ArrayPtr<const_unsigned_char> prefix_00;
  ArrayPtr<const_unsigned_char> prefix_01;
  char (*in_stack_fffffffffffffce8) [94];
  char (*in_stack_fffffffffffffd08) [70];
  ProcessContext *pPVar8;
  StringPtr local_210;
  StringPtr local_200;
  NullableValue<capnp::compiler::CompilerMain::Format> local_1f0;
  Compiler *local_1e8;
  StringPtr local_1e0;
  NullableValue<capnp::compiler::CompilerMain::Format> local_1d0;
  Compiler *local_1c8;
  ArrayPtr<const_char> local_1c0;
  ArrayPtr<const_char> local_1b0;
  String local_1a0;
  StringPtr local_188;
  ArrayPtr<const_char> local_178;
  ArrayPtr<const_char> local_168;
  ArrayPtr<const_char> local_158;
  ArrayPtr<const_char> local_148;
  String local_138;
  StringPtr local_120;
  Format *local_110;
  Format *guess_1;
  Compiler *pCStack_100;
  undefined1 local_f8 [8];
  NullableValue<capnp::compiler::CompilerMain::Format> local_f0;
  NullableValue<capnp::compiler::CompilerMain::Format> _guess1608;
  String local_d8;
  undefined4 local_bc;
  char local_b8 [16];
  char local_a8 [16];
  String local_98;
  undefined8 local_80;
  Format *guess;
  NullableValue<capnp::compiler::CompilerMain::Format> local_68;
  Compiler *pCStack_60;
  undefined1 local_58 [8];
  NullableValue<capnp::compiler::CompilerMain::Format> local_50;
  NullableValue<capnp::compiler::CompilerMain::Format> _guess1598;
  Format format_local;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  pCVar6 = (Compiler *)prefix.size_;
  NVar5 = (NullableValue<capnp::compiler::CompilerMain::Format>)prefix.ptr;
  params_2 = pCVar6;
  _guess1598 = NVar5;
  PVar2 = isPlausibly(this,format,prefix);
  switch(PVar2) {
  case IMPOSSIBLE:
    prefix_00.size_._0_1_ = NVar5.isSet;
    prefix_00.size_._1_3_ = NVar5._1_3_;
    prefix_00.size_._4_4_ = NVar5.field_1;
    prefix_00.ptr = (uchar *)this;
    local_68 = NVar5;
    pCStack_60 = pCVar6;
    guessFormat((CompilerMain *)local_58,prefix_00);
    pNVar3 = kj::_::readMaybe<capnp::compiler::CompilerMain::Format>
                       ((Maybe<capnp::compiler::CompilerMain::Format> *)local_58);
    kj::_::NullableValue<capnp::compiler::CompilerMain::Format>::NullableValue
              ((NullableValue<capnp::compiler::CompilerMain::Format> *)(local_58 + 8),pNVar3);
    kj::Maybe<capnp::compiler::CompilerMain::Format>::~Maybe
              ((Maybe<capnp::compiler::CompilerMain::Format> *)local_58);
    pFVar4 = kj::_::NullableValue::operator_cast_to_Format_((NullableValue *)(local_58 + 8));
    if (pFVar4 == (Format *)0x0) {
      SVar7 = toString(this,format);
      _guess1608 = (NullableValue<capnp::compiler::CompilerMain::Format>)SVar7.content.ptr;
      kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[10]>
                (&local_d8,(kj *)"The input is not in \"",&_guess1608.isSet,
                 (StringPtr *)"\" format.",(char (*) [10])params_2);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_d8);
      kj::String::~String(&local_d8);
    }
    else {
      local_80 = kj::_::NullableValue<capnp::compiler::CompilerMain::Format>::operator*
                           ((NullableValue<capnp::compiler::CompilerMain::Format> *)(local_58 + 8));
      local_a8 = (char  [16])toString(this,format);
      local_b8 = (char  [16])toString(this,*(Format *)&((Disposer *)local_80)->_vptr_Disposer);
      kj::str<char_const(&)[22],kj::StringPtr,char_const(&)[35],kj::StringPtr,char_const(&)[28]>
                (&local_98,(kj *)"The input is not in \"",(char (*) [22])local_a8,
                 (StringPtr *)"\" format. It looks like it is in \"",(char (*) [35])local_b8,
                 (StringPtr *)"\" format. Try that instead.",
                 (char (*) [28])in_stack_fffffffffffffce8);
      kj::MainBuilder::Validity::Validity(__return_storage_ptr__,&local_98);
      kj::String::~String(&local_98);
    }
    local_bc = 1;
    kj::_::NullableValue<capnp::compiler::CompilerMain::Format>::~NullableValue
              ((NullableValue<capnp::compiler::CompilerMain::Format> *)(local_58 + 8));
    break;
  case IMPLAUSIBLE:
    prefix_01.size_._0_1_ = NVar5.isSet;
    prefix_01.size_._1_3_ = NVar5._1_3_;
    prefix_01.size_._4_4_ = NVar5.field_1;
    prefix_01.ptr = (uchar *)this;
    guess_1 = (Format *)NVar5;
    pCStack_100 = pCVar6;
    guessFormat((CompilerMain *)local_f8,prefix_01);
    pNVar3 = kj::_::readMaybe<capnp::compiler::CompilerMain::Format>
                       ((Maybe<capnp::compiler::CompilerMain::Format> *)local_f8);
    kj::_::NullableValue<capnp::compiler::CompilerMain::Format>::NullableValue
              ((NullableValue<capnp::compiler::CompilerMain::Format> *)(local_f8 + 8),pNVar3);
    kj::Maybe<capnp::compiler::CompilerMain::Format>::~Maybe
              ((Maybe<capnp::compiler::CompilerMain::Format> *)local_f8);
    pFVar4 = kj::_::NullableValue::operator_cast_to_Format_((NullableValue *)(local_f8 + 8));
    if (pFVar4 == (Format *)0x0) {
      pPVar8 = this->context;
      local_1b0 = (ArrayPtr<const_char>)toString(this,format);
      local_1c0 = (ArrayPtr<const_char>)toString(this,format);
      kj::str<char_const(&)[58],kj::StringPtr,char_const(&)[67],kj::StringPtr,char_const(&)[94]>
                (&local_1a0,(kj *)"*** WARNING ***\nThe input data does not appear to be in \"",
                 (char (*) [58])&local_1b0,
                 (StringPtr *)
                 "\" format, nor\nin any other known format. I\'ll try to parse it in \"",
                 (char (*) [67])&local_1c0,
                 (StringPtr *)
                 "\"\nformat anyway, as you requested. Use --quiet to suppress this warning.\n*** END WARNING ***\n"
                 ,in_stack_fffffffffffffce8);
      kj::StringPtr::StringPtr(&local_188,&local_1a0);
      (*pPVar8->_vptr_ProcessContext[2])(pPVar8,local_188.content.ptr,local_188.content.size_);
      kj::String::~String(&local_1a0);
    }
    else {
      local_110 = kj::_::NullableValue<capnp::compiler::CompilerMain::Format>::operator*
                            ((NullableValue<capnp::compiler::CompilerMain::Format> *)(local_f8 + 8))
      ;
      pPVar8 = this->context;
      local_148 = (ArrayPtr<const_char>)toString(this,format);
      local_158 = (ArrayPtr<const_char>)toString(this,*local_110);
      local_168 = (ArrayPtr<const_char>)toString(this,format);
      local_178 = (ArrayPtr<const_char>)toString(this,format);
      kj::
      str<char_const(&)[58],kj::StringPtr,char_const(&)[39],kj::StringPtr,char_const(&)[36],kj::StringPtr,char_const(&)[57],kj::StringPtr,char_const(&)[70]>
                (&local_138,(kj *)"*** WARNING ***\nThe input data does not appear to be in \"",
                 (char (*) [58])&local_148,(StringPtr *)"\" format. It\nlooks like it may be in \"",
                 (char (*) [39])&local_158,(StringPtr *)"\" format. I\'ll try to parse\nit in \"",
                 (char (*) [36])&local_168,
                 (StringPtr *)"\" format as you requested, but if it doesn\'t work,\ntry \"",
                 (char (*) [57])&local_178,
                 (StringPtr *)
                 "\" instead. Use --quiet to suppress this warning.\n*** END WARNING ***\n",
                 in_stack_fffffffffffffd08);
      kj::StringPtr::StringPtr(&local_120,&local_138);
      (*pPVar8->_vptr_ProcessContext[2])(pPVar8,local_120.content.ptr,local_120.content.size_);
      kj::String::~String(&local_138);
    }
    kj::_::NullableValue<capnp::compiler::CompilerMain::Format>::~NullableValue
              ((NullableValue<capnp::compiler::CompilerMain::Format> *)(local_f8 + 8));
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
    break;
  case WRONG_TYPE:
    if (format == FLAT) {
      local_1d0 = NVar5;
      local_1c8 = pCVar6;
      PVar2 = isPlausiblyBinary(this,prefix);
      bVar1 = plausibleOrWrongType(this,PVar2);
      if (!bVar1) goto LAB_0013be45;
      pPVar8 = this->context;
      kj::StringPtr::StringPtr
                (&local_1e0,
                 "*** WARNING ***\nThe input data does not appear to match the schema that you specified. I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right schema. This could also be because the input is not in \"flat\"\nformat; indeed, it looks like this input may be in regular binary format,\nso you might want to try \"binary\" instead.  Use --quiet to suppress this\nwarning.\n*** END WARNING ***\n"
                );
      (*pPVar8->_vptr_ProcessContext[2])(pPVar8,local_1e0.content.ptr,local_1e0.content.size_);
    }
    else {
LAB_0013be45:
      if (format == FLAT_PACKED) {
        local_1f0 = NVar5;
        local_1e8 = pCVar6;
        PVar2 = isPlausiblyPacked(this,prefix);
        bVar1 = plausibleOrWrongType(this,PVar2);
        if (bVar1) {
          pPVar8 = this->context;
          kj::StringPtr::StringPtr
                    (&local_200,
                     "*** WARNING ***\nThe input data does not appear to match the schema that you specified. I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right schema. This could also be because the input is not in \"flat-packed\"\nformat; indeed, it looks like this input may be in regular packed format,\nso you might want to try \"packed\" instead.  Use --quiet to suppress this\nwarning.\n*** END WARNING ***\n"
                    );
          (*pPVar8->_vptr_ProcessContext[2])(pPVar8,local_200.content.ptr,local_200.content.size_);
          goto LAB_0013bf17;
        }
      }
      pPVar8 = this->context;
      kj::StringPtr::StringPtr
                (&local_210,
                 "*** WARNING ***\nThe input data does not appear to be the type that you specified.  I\'ll try\nto parse it anyway, but if it doesn\'t look right, please verify that you\nhave the right type.  Use --quiet to suppress this warning.\n*** END WARNING ***\n"
                );
      (*pPVar8->_vptr_ProcessContext[2])(pPVar8,local_210.content.ptr,local_210.content.size_);
    }
LAB_0013bf17:
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
    break;
  case PLAUSIBLE:
    kj::MainBuilder::Validity::Validity(__return_storage_ptr__,true);
    break;
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

kj::MainBuilder::Validity checkPlausibility(Format format, kj::ArrayPtr<const byte> prefix) {
    switch (isPlausibly(format, prefix)) {
      case PLAUSIBLE:
        return true;

      case IMPOSSIBLE:
        KJ_IF_SOME(guess, guessFormat(prefix)) {
          return kj::str(
             "The input is not in \"", toString(format), "\" format. It looks like it is in \"",
             toString(guess), "\" format. Try that instead.");
        } else {
          return kj::str(
             "The input is not in \"", toString(format), "\" format.");
        }

      case IMPLAUSIBLE:
        KJ_IF_SOME(guess, guessFormat(prefix)) {
          context.warning(kj::str(
              "*** WARNING ***\n"
              "The input data does not appear to be in \"", toString(format), "\" format. It\n"
              "looks like it may be in \"", toString(guess), "\" format. I'll try to parse\n"
              "it in \"", toString(format), "\" format as you requested, but if it doesn't work,\n"
              "try \"", toString(format), "\" instead. Use --quiet to suppress this warning.\n"
              "*** END WARNING ***\n"));
        } else {
          context.warning(kj::str(
              "*** WARNING ***\n"
              "The input data does not appear to be in \"", toString(format), "\" format, nor\n"
              "in any other known format. I'll try to parse it in \"", toString(format), "\"\n"
              "format anyway, as you requested. Use --quiet to suppress this warning.\n"
              "*** END WARNING ***\n"));
        }